

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O3

void __thiscall ExprTest_Cast_Test::TestBody(ExprTest_Cast_Test *this)

{
  bool bVar1;
  ExprBase EVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  Expr e;
  ExprBase local_30;
  AssertHelper local_28;
  internal local_20 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> local_10;
  
  local_10.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
                 (&(this->super_ExprTest).factory_,42.0);
  local_30.impl_ = (Impl *)0x0;
  if (((Impl *)local_10.super_ExprBase.impl_)->kind_ - FIRST_EXPR < 0x2f) {
    local_30.impl_ = (Impl *)local_10.super_ExprBase.impl_;
  }
  testing::internal::
  CmpHelperEQ<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (local_20,"e","mp::Cast<NumericExpr>(e)",&local_10,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)&local_30);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x27a
               ,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30.impl_ != (Impl *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_30.impl_ != (Impl *)0x0)) {
        (**(code **)(*(long *)local_30.impl_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  EVar2.impl_ = (Impl *)0x0;
  if (*(Kind *)local_10.super_ExprBase.impl_ == FIRST_EXPR) {
    EVar2.impl_ = (Impl *)local_10.super_ExprBase.impl_;
  }
  local_28.data_._0_4_ = 0x2a;
  local_30.impl_ = *(Impl **)(EVar2.impl_ + 2);
  testing::internal::CmpHelperEQ<int,double>
            (local_20,"42","n.value()",(int *)&local_28,(double *)&local_30);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x27c
               ,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30.impl_ != (Impl *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_30.impl_ != (Impl *)0x0)) {
        (**(code **)(*(long *)local_30.impl_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_30.impl_ = (Impl *)0x0;
  local_28.data_ = (AssertHelperData *)(Impl *)0x0;
  if (*(Kind *)local_10.super_ExprBase.impl_ - FIRST_UNARY < 0x15) {
    local_28.data_ = (AssertHelperData *)local_10.super_ExprBase.impl_;
  }
  testing::internal::
  CmpHelperEQ<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>,mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
            (local_20,"mp::UnaryExpr()","mp::Cast<mp::UnaryExpr>(e)",
             (BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
              *)&local_30,
             (BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
              *)&local_28);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x27d
               ,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30.impl_ != (Impl *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_30.impl_ != (Impl *)0x0)) {
        (**(code **)(*(long *)local_30.impl_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(ExprTest, Cast) {
  Expr e = factory_.MakeNumericConstant(42);
  EXPECT_EQ(e, mp::Cast<NumericExpr>(e));
  mp::NumericConstant n = mp::Cast<mp::NumericConstant>(e);
  EXPECT_EQ(42, n.value());
  EXPECT_EQ(mp::UnaryExpr(), mp::Cast<mp::UnaryExpr>(e));
}